

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.h
# Opt level: O3

int WriteDataLIRMIA3(LIRMIA3 *pLIRMIA3,uchar M1,uchar M2,uchar M3,uchar M4)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  uchar sendbuf [256];
  timespec local_148;
  undefined2 local_138;
  undefined1 local_136;
  uchar local_135;
  uchar local_134;
  uchar local_133;
  uchar local_132;
  
  uVar4 = 0;
  memset(&local_138,0,0x100);
  local_138 = 0x454;
  local_136 = 4;
  iVar1 = (pLIRMIA3->RS232Port).DevType;
  local_135 = M1;
  local_134 = M2;
  local_133 = M3;
  local_132 = M4;
  if (iVar1 - 1U < 4) {
    iVar1 = (pLIRMIA3->RS232Port).s;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_138 + uVar4),(ulong)(7 - (int)uVar4),0);
      if ((int)sVar2 < 1) {
        return 1;
      }
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 7);
  }
  else {
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = *(int *)&(pLIRMIA3->RS232Port).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_138 + uVar4),(ulong)(7 - (int)uVar4));
      if ((int)sVar2 < 1) {
        return 1;
      }
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 7);
  }
  if ((pLIRMIA3->bSaveRawData != 0) && ((FILE *)pLIRMIA3->pfSaveFile != (FILE *)0x0)) {
    fwrite(&local_138,7,1,(FILE *)pLIRMIA3->pfSaveFile);
    fflush((FILE *)pLIRMIA3->pfSaveFile);
  }
  local_148.tv_sec = 0;
  local_148.tv_nsec = 10000000;
  nanosleep(&local_148,(timespec *)0x0);
  return 0;
}

Assistant:

inline int WriteDataLIRMIA3(LIRMIA3* pLIRMIA3, unsigned char M1, unsigned char M2, unsigned char M3, unsigned char M4)
{
	unsigned char sendbuf[MAX_NB_BYTES_LIRMIA3];
	int sendbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)0x54; // Read or Write multiple bytes for devices without internal address or where address does not require resetting.
	sendbuf[1] = (unsigned char)0x04; // I2C address
	sendbuf[2] = (unsigned char)0x04; // Number of bytes to write
	sendbuf[3] = M1;
	sendbuf[4] = M2;
	sendbuf[5] = M3;
	sendbuf[6] = M4;
	sendbuflen = 7;
	
	if (WriteAllRS232Port(&pLIRMIA3->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pLIRMIA3->bSaveRawData)&&(pLIRMIA3->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pLIRMIA3->pfSaveFile);
		fflush(pLIRMIA3->pfSaveFile);
	}

	mSleep(10);

	return EXIT_SUCCESS;
}